

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SList.h
# Opt level: O0

bool __thiscall
SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount>::Equals
          (SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *this,
          SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *other)

{
  Type pOVar1;
  code *pcVar2;
  undefined1 this_00 [8];
  NodeBase *this_01;
  bool bVar3;
  undefined4 *puVar4;
  Type_conflict pSVar5;
  Type *ppOVar6;
  undefined1 local_70 [8];
  Iterator iter2;
  Iterator iter;
  SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *other_local;
  SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *this_local;
  
  Iterator::Iterator((Iterator *)&iter2.current,this);
  Iterator::Iterator((Iterator *)local_70,other);
  while( true ) {
    if (iter.list == (SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                         ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    this_01 = iter2.current;
    pSVar5 = SListNodeBase<Memory::ArenaAllocator>::Next
                       (&(iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
    bVar3 = IsHead((SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *)this_01,pSVar5);
    if (bVar3) {
      if (iter2.list == (SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                           ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
      pSVar5 = SListNodeBase<Memory::ArenaAllocator>::Next
                         (&(iter2.list)->super_SListNodeBase<Memory::ArenaAllocator>);
      bVar3 = IsHead((SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *)local_70,pSVar5);
      if (!bVar3) {
        SListNodeBase<Memory::ArenaAllocator>::Next
                  (&(iter2.list)->super_SListNodeBase<Memory::ArenaAllocator>);
        return bVar3;
      }
      return bVar3;
    }
    iter.list = (SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *)
                SListNodeBase<Memory::ArenaAllocator>::Next
                          (&(iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
    if (iter2.list == (SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                         ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    this_00 = local_70;
    pSVar5 = SListNodeBase<Memory::ArenaAllocator>::Next
                       (&(iter2.list)->super_SListNodeBase<Memory::ArenaAllocator>);
    bVar3 = IsHead((SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *)this_00,pSVar5);
    if (bVar3) break;
    iter2.list = (SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *)
                 SListNodeBase<Memory::ArenaAllocator>::Next
                           (&(iter2.list)->super_SListNodeBase<Memory::ArenaAllocator>);
    ppOVar6 = Iterator::Data((Iterator *)&iter2.current);
    pOVar1 = *ppOVar6;
    ppOVar6 = Iterator::Data((Iterator *)local_70);
    if (pOVar1 != *ppOVar6) {
      return false;
    }
  }
  return false;
}

Assistant:

bool Equals(SListBase const& other)
    {
        SListBase::Iterator iter(this);
        SListBase::Iterator iter2(&other);
        while (iter.Next())
        {
            if (!iter2.Next() || iter.Data() != iter2.Data())
            {
                return false;
            }
        }
        return !iter2.Next();
    }